

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::maintenance,_unsigned_long>
::process_event<vending::events::load_goods>
          (state_transition_table<afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::maintenance,_unsigned_long>
           *this,load_goods *event)

{
  size_t current_state;
  event_process_result local_1c;
  event_process_result res;
  load_goods *event_local;
  state_transition_table<afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::maintenance,_unsigned_long>
  *this_local;
  
  current_state =
       state_transition_table<afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_vending::vending_def::on::maintenance,_unsigned_long>
       ::current_state(this);
  local_1c = actions::detail::
             inner_dispatch_table<std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<vending::vending_def::on::maintenance::idle,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
             ::process_event<vending::events::load_goods>(&this->states_,current_state,event);
  if (local_1c == refuse) {
    local_1c = process_transition_event<vending::events::load_goods>(this,event);
  }
  if (local_1c == process) {
    check_default_transition(this);
  }
  return local_1c;
}

Assistant:

actions::event_process_result
    process_event(Event&& event)
    {
        // Try dispatch to inner states
        auto res = dispatch_table::process_event(states_, current_state(),
                ::std::forward<Event>(event));
        if (res == actions::event_process_result::refuse) {
            // Check if the event can cause a transition and process it
            res = process_transition_event(::std::forward<Event>(event));
        }
        if (res == actions::event_process_result::process) {
            check_default_transition();
        }
        return res;
    }